

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

optional<bool>
anon_unknown.dwarf_14eae::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  StringEntry *__s;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  StringEntry *pSVar5;
  long *plVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  ulong uVar12;
  ushort uVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  StringEntry *se [2];
  char *se_name [2];
  cmELF elf;
  ofstream f;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_3a0 [32];
  string *local_380;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_378;
  char local_358;
  StringEntry *local_348 [2];
  char *local_338 [2];
  long local_328;
  ulong local_320;
  ulong local_318;
  char *local_310;
  cmAlphaNum local_308;
  undefined1 local_2d8 [8];
  char *local_2d0;
  size_t local_2c8;
  StringEntry *local_2c0;
  byte local_2b8 [8];
  char *local_2b0;
  ios_base local_1e0 [264];
  undefined1 local_d8 [48];
  ulong local_a8 [12];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar4 = 0xa0;
  puVar8 = local_d8 + 0x20;
  do {
    *(undefined1 **)(puVar8 + -0x10) = puVar8;
    *(undefined8 *)(puVar8 + -8) = 0;
    *puVar8 = 0;
    *(undefined1 **)(puVar8 + 0x10) = puVar8 + 0x20;
    *(undefined8 *)(puVar8 + 0x18) = 0;
    puVar8[0x20] = 0;
    puVar8 = puVar8 + 0x50;
    lVar4 = lVar4 + -0x50;
  } while (lVar4 != 0);
  local_380 = file;
  cmELF::cmELF((cmELF *)&local_308,(file->_M_dataplus)._M_p);
  bVar1 = cmELF::Valid((cmELF *)&local_308);
  if (bVar1) {
    local_348[0] = (StringEntry *)0x0;
    local_348[1] = (StringEntry *)0x0;
    local_338[0] = (char *)0x0;
    local_338[1] = (char *)0x0;
    pSVar5 = cmELF::GetRPath((cmELF *)&local_308);
    if (pSVar5 != (StringEntry *)0x0) {
      local_338[0] = "RPATH";
      local_348[0] = pSVar5;
    }
    uVar10 = (uint)(pSVar5 != (StringEntry *)0x0);
    pSVar5 = cmELF::GetRunPath((cmELF *)&local_308);
    if (pSVar5 != (StringEntry *)0x0) {
      *(StringEntry **)((long)local_348 + (ulong)(uVar10 * 8)) = pSVar5;
      *(char **)((long)local_338 + (ulong)(uVar10 * 8)) = "RUNPATH";
      uVar10 = uVar10 + 1;
    }
    if (uVar10 == 0) {
      local_2d8 = (undefined1  [8])emsg;
      if ((emptyCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001192f0:
        uVar7 = std::__throw_bad_function_call();
        std::ofstream::~ofstream(local_2d8);
        lVar4 = 0x50;
        do {
          cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
                    ((cmSystemToolsRPathInfo *)(local_d8 + lVar4));
          lVar4 = lVar4 + -0x50;
        } while (lVar4 != -0x50);
        _Unwind_Resume(uVar7);
      }
      bVar1 = (*emptyCallback->_M_invoker)
                        ((_Any_data *)emptyCallback,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         local_2d8,(cmELF *)&local_308);
      uVar13 = (ushort)bVar1;
      bVar1 = false;
      bVar2 = true;
      uVar10 = 0;
    }
    else {
      bVar1 = uVar10 == 0;
      if (uVar10 == 0) {
        bVar2 = true;
        uVar10 = 0;
      }
      else {
        local_320 = (ulong)uVar10;
        local_328 = -(ulong)uVar10;
        bVar2 = true;
        uVar9 = 1;
        uVar10 = 0;
        do {
          if ((uVar10 == 0) || (uVar12 = uVar9, local_d8._0_8_ != local_348[uVar9 - 1]->Position)) {
            pSVar5 = local_348[uVar9 - 1];
            lVar4 = (long)(int)uVar10 * 0x50;
            *(unsigned_long *)(local_d8 + lVar4) = pSVar5->Position;
            *(unsigned_long *)(local_d8 + lVar4 + 8) = pSVar5->Size;
            local_318 = uVar9;
            __s = local_348[uVar9 + 1];
            local_310 = *(char **)(local_d8 + lVar4 + 0x18);
            strlen((char *)__s);
            std::__cxx11::string::_M_replace
                      ((ulong)(local_d8 + lVar4 + 0x10),0,local_310,(ulong)__s);
            local_358 = '\0';
            local_3a0._0_8_ = emsg;
            local_2d8 = (undefined1  [8])__s;
            if ((adjustCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
              goto LAB_001192f0;
            }
            bVar3 = (*adjustCallback->_M_invoker)
                              ((_Any_data *)adjustCallback,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_378._M_value,&pSVar5->Value,(char **)local_2d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )local_3a0);
            if (bVar3) {
              bVar3 = true;
              if (local_358 == '\x01') {
                if (local_378._M_value._M_string_length != 0) {
                  bVar2 = false;
                }
                if (*(ulong *)(local_d8 + lVar4 + 8) < local_378._M_value._M_string_length + 1) {
                  if (emsg == (string *)0x0) goto LAB_00118eb4;
                  local_2c8 = strlen((char *)__s);
                  local_2d8 = (undefined1  [8])0x29;
                  local_2d0 = "The replacement path is too long for the ";
                  local_2b8[0] = 7;
                  local_2b8[1] = 0;
                  local_2b8[2] = 0;
                  local_2b8[3] = 0;
                  local_2b8[4] = 0;
                  local_2b8[5] = 0;
                  local_2b8[6] = 0;
                  local_2b8[7] = 0;
                  local_2b0 = " entry.";
                  views._M_len = 3;
                  views._M_array = (iterator)local_2d8;
                  local_2c0 = __s;
                  cmCatViews_abi_cxx11_((string *)local_3a0,views);
                  std::__cxx11::string::operator=((string *)emsg,(string *)local_3a0);
                  if ((string *)local_3a0._0_8_ != (string *)(local_3a0 + 0x10)) {
                    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
                  }
                  bVar3 = false;
                }
                else {
                  std::__cxx11::string::operator=
                            ((string *)(local_a8 + (long)(int)uVar10 * 10),
                             (string *)&local_378._M_value);
                  uVar10 = uVar10 + 1;
                }
              }
              else {
                bVar2 = false;
              }
            }
            else {
LAB_00118eb4:
              bVar3 = false;
            }
            if ((local_358 == '\x01') &&
               (local_358 = '\0',
               local_378._M_value._M_dataplus._M_p != (_Alloc_hider)&local_378._M_value.field_2)) {
              operator_delete((void *)local_378._M_value._M_dataplus._M_p,local_378._16_8_ + 1);
            }
            uVar12 = local_318;
            if (!bVar3) break;
          }
          bVar1 = local_320 <= uVar12;
          uVar9 = uVar12 + 1;
        } while (local_328 + uVar12 != 0);
      }
      uVar13 = 0;
    }
    uVar11 = 0x100;
  }
  else {
    uVar13 = 0;
    bVar2 = true;
    uVar11 = 0;
    bVar1 = false;
    uVar10 = 0;
  }
  cmELF::~cmELF((cmELF *)&local_308);
  if (bVar1) {
    uVar11 = 0x100;
    uVar13 = 1;
    if (uVar10 != 0) {
      if (bVar2) {
        bVar1 = cmSystemTools::RemoveRPath(local_380,emsg,changed);
        uVar13 = (ushort)bVar1;
      }
      else {
        std::ofstream::ofstream(local_2d8,(local_380->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
        if ((local_2b8[((StringEntry *)((long)local_2d8 + -0x38))->Position] & 5) == 0) {
          if (0 < (int)uVar10) {
            uVar9 = 0;
            do {
              lVar4 = uVar9 * 0x50;
              plVar6 = (long *)std::ostream::seekp((ostream *)local_2d8,
                                                   *(undefined8 *)(local_d8 + lVar4),0);
              if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
                if (emsg != (string *)0x0) {
                  local_308.View_._M_len = 0x11;
                  local_308.View_._M_str = "Error seeking to ";
                  local_378._M_value._M_string_length = *(undefined8 *)(local_d8 + lVar4 + 0x10);
                  local_378._M_value._M_dataplus._M_p =
                       (_Alloc_hider)*(undefined8 *)(local_d8 + lVar4 + 0x18);
                  cmStrCat<char[11]>((string *)local_3a0,&local_308,
                                     (cmAlphaNum *)&local_378._M_value,(char (*) [11])0x262f37);
LAB_0011921c:
                  std::__cxx11::string::operator=((string *)emsg,(string *)local_3a0);
                  if ((string *)local_3a0._0_8_ != (string *)(local_3a0 + 0x10)) {
                    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
                  }
                }
LAB_00119246:
                local_2d8 = (undefined1  [8])_VTT;
                *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _vtable;
                std::filebuf::~filebuf((filebuf *)&local_2d0);
                std::ios_base::~ios_base(local_1e0);
                uVar13 = 0;
                goto LAB_00119281;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)local_a8[uVar9 * 10],local_a8[uVar9 * 10 + 1])
              ;
              for (uVar12 = local_a8[uVar9 * 10 + 1]; uVar12 < *(ulong *)(local_d8 + lVar4 + 8);
                  uVar12 = uVar12 + 1) {
                local_308.View_._M_len = local_308.View_._M_len & 0xffffffffffffff00;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2d8,(char *)&local_308,1);
              }
              if ((local_2b8[((StringEntry *)((long)local_2d8 + -0x38))->Position] & 5) != 0) {
                if (emsg != (string *)0x0) {
                  local_308.View_._M_len = 0x16;
                  local_308.View_._M_str = "Error writing the new ";
                  local_378._M_value._M_string_length = *(undefined8 *)(local_d8 + lVar4 + 0x10);
                  local_378._M_value._M_dataplus._M_p =
                       (_Alloc_hider)*(undefined8 *)(local_d8 + lVar4 + 0x18);
                  cmStrCat<char[21]>((string *)local_3a0,&local_308,
                                     (cmAlphaNum *)&local_378._M_value,(char (*) [21])0x262f5f);
                  goto LAB_0011921c;
                }
                goto LAB_00119246;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar10);
          }
          local_2d8 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _vtable;
          std::filebuf::~filebuf((filebuf *)&local_2d0);
          std::ios_base::~ios_base(local_1e0);
          uVar13 = 1;
          if (changed != (bool *)0x0) {
            *changed = true;
          }
LAB_00119281:
          uVar11 = 0x100;
        }
        else {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x262dd9);
          }
          local_2d8 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _vtable;
          std::filebuf::~filebuf((filebuf *)&local_2d0);
          std::ios_base::~ios_base(local_1e0);
          uVar13 = 0;
        }
      }
    }
  }
  lVar4 = -0xa0;
  plVar6 = local_48;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    if (plVar6 + -4 != (long *)plVar6[-6]) {
      operator_delete((long *)plVar6[-6],plVar6[-4] + 1);
    }
    plVar6 = plVar6 + -10;
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar13 | uVar11);
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}